

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cc
# Opt level: O1

string * __thiscall ConfigFile::trim(string *__return_storage_ptr__,ConfigFile *this,string *str)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  pointer pcVar4;
  int iVar5;
  char *pcVar6;
  pointer pcVar7;
  char *pcVar8;
  long lVar9;
  pointer pcVar10;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar10 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar10,pcVar10 + str->_M_string_length);
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  uVar3 = __return_storage_ptr__->_M_string_length;
  pcVar1 = pcVar2 + uVar3;
  pcVar6 = pcVar2;
  if (0 < (long)uVar3 >> 2) {
    pcVar6 = pcVar2 + (uVar3 & 0xfffffffffffffffc);
    lVar9 = ((long)uVar3 >> 2) + 1;
    pcVar8 = pcVar2 + 3;
    do {
      iVar5 = isspace((int)pcVar8[-3]);
      if (iVar5 == 0) {
        pcVar8 = pcVar8 + -3;
        goto LAB_0013dd32;
      }
      iVar5 = isspace((int)pcVar8[-2]);
      if (iVar5 == 0) {
        pcVar8 = pcVar8 + -2;
        goto LAB_0013dd32;
      }
      iVar5 = isspace((int)pcVar8[-1]);
      if (iVar5 == 0) {
        pcVar8 = pcVar8 + -1;
        goto LAB_0013dd32;
      }
      iVar5 = isspace((int)*pcVar8);
      if (iVar5 == 0) goto LAB_0013dd32;
      lVar9 = lVar9 + -1;
      pcVar8 = pcVar8 + 4;
    } while (1 < lVar9);
  }
  lVar9 = (long)pcVar1 - (long)pcVar6;
  if (lVar9 == 1) {
LAB_0013dd0f:
    iVar5 = isspace((int)*pcVar6);
    pcVar8 = pcVar6;
    if (iVar5 != 0) {
      pcVar8 = pcVar1;
    }
  }
  else if (lVar9 == 2) {
LAB_0013dcff:
    iVar5 = isspace((int)*pcVar6);
    pcVar8 = pcVar6;
    if (iVar5 != 0) {
      pcVar6 = pcVar6 + 1;
      goto LAB_0013dd0f;
    }
  }
  else {
    pcVar8 = pcVar1;
    if ((lVar9 == 3) && (iVar5 = isspace((int)*pcVar6), pcVar8 = pcVar6, iVar5 != 0)) {
      pcVar6 = pcVar6 + 1;
      goto LAB_0013dcff;
    }
  }
LAB_0013dd32:
  if (pcVar1 == pcVar8) {
    __return_storage_ptr__->_M_string_length = 0;
    *pcVar2 = '\0';
  }
  else {
    std::__cxx11::string::_M_erase((ulong)__return_storage_ptr__,0);
  }
  pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
  pcVar10 = pcVar4 + __return_storage_ptr__->_M_string_length;
  lVar9 = (long)__return_storage_ptr__->_M_string_length >> 2;
  pcVar7 = pcVar10;
  if (0 < lVar9) {
    pcVar7 = pcVar10 + lVar9 * -4;
    lVar9 = lVar9 + 1;
    do {
      iVar5 = isspace((int)pcVar10[-1]);
      if (iVar5 == 0) goto LAB_0013de28;
      iVar5 = isspace((int)pcVar10[-2]);
      if (iVar5 == 0) {
        pcVar10 = pcVar10 + -1;
        goto LAB_0013de28;
      }
      iVar5 = isspace((int)pcVar10[-3]);
      if (iVar5 == 0) {
        pcVar10 = pcVar10 + -2;
        goto LAB_0013de28;
      }
      iVar5 = isspace((int)pcVar10[-4]);
      if (iVar5 == 0) {
        pcVar10 = pcVar10 + -3;
        goto LAB_0013de28;
      }
      pcVar10 = pcVar10 + -4;
      lVar9 = lVar9 + -1;
    } while (1 < lVar9);
  }
  lVar9 = (long)pcVar7 - (long)pcVar4;
  if (lVar9 != 1) {
    if (lVar9 != 2) {
      pcVar10 = pcVar4;
      if ((lVar9 != 3) || (iVar5 = isspace((int)pcVar7[-1]), pcVar10 = pcVar7, iVar5 == 0))
      goto LAB_0013de28;
      pcVar7 = pcVar7 + -1;
    }
    iVar5 = isspace((int)pcVar7[-1]);
    pcVar10 = pcVar7;
    if (iVar5 == 0) goto LAB_0013de28;
    pcVar7 = pcVar7 + -1;
  }
  iVar5 = isspace((int)pcVar7[-1]);
  pcVar10 = pcVar7;
  if (iVar5 != 0) {
    pcVar10 = pcVar4;
  }
LAB_0013de28:
  __return_storage_ptr__->_M_string_length = (long)pcVar10 - (long)pcVar4;
  *pcVar10 = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string
ConfigFile::trim(const std::string &str) {
  std::string tmp = str;
  tmp.erase(tmp.begin(),
            std::find_if(tmp.begin(), tmp.end(),
                         [](int c) {return !std::isspace(c);}));
  tmp.erase(std::find_if(tmp.rbegin(), tmp.rend(),
                         [](int c) {return !std::isspace(c);})
                .base(),
            tmp.end());

  return tmp;
}